

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minideen.hpp
# Opt level: O2

DSFrame * __thiscall
MiniDeen::GetFrame(DSFrame *__return_storage_ptr__,MiniDeen *this,int n,
                  unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                  *in_frames)

{
  int height;
  mapped_type *old;
  byte bVar1;
  byte bVar2;
  int iVar3;
  int p;
  long lVar4;
  bool bVar5;
  int n_local;
  mapped_type src;
  
  n_local = n;
  old = std::__detail::
        _Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::operator[]((_Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)in_frames,&n_local);
  DSFrame::DSFrame(&src,old);
  if (this->bypass == true) {
    DSFrame::DSFrame(__return_storage_ptr__,&src);
  }
  else {
    DSFrame::Create(__return_storage_ptr__,&src,false);
    lVar4 = 0;
    while( true ) {
      if ((this->super_Filter).in_vi.Format.Planes <= lVar4) break;
      bVar5 = ((this->super_Filter).in_vi.Format.IsFamilyYUV & (int)lVar4 - 1U < 2) == 0;
      bVar1 = (byte)(this->super_Filter).in_vi.Format.SSH;
      if (bVar5) {
        bVar1 = 0;
      }
      bVar2 = (byte)(this->super_Filter).in_vi.Format.SSW;
      if (bVar5) {
        bVar2 = 0;
      }
      height = (this->super_Filter).in_vi.Height >> (bVar1 & 0x1f);
      iVar3 = (this->super_Filter).in_vi.Width >> (bVar2 & 0x1f);
      if (this->process[lVar4] == 3) {
        (*this->minideen_core)
                  (src.SrcPointers[lVar4],__return_storage_ptr__->DstPointers[lVar4],iVar3,height,
                   src.StrideBytes[lVar4],__return_storage_ptr__->StrideBytes[lVar4],
                   this->threshold[lVar4],this->radius[lVar4]);
      }
      else if (this->process[lVar4] == 2) {
        framecpy(this,__return_storage_ptr__->DstPointers[lVar4],
                 __return_storage_ptr__->StrideBytes[lVar4],src.SrcPointers[lVar4],
                 src.StrideBytes[lVar4],iVar3 * (this->super_Filter).in_vi.Format.BytesPerSample,
                 height);
      }
      lVar4 = lVar4 + 1;
    }
  }
  DSFrame::~DSFrame(&src);
  return __return_storage_ptr__;
}

Assistant:

DSFrame GetFrame(int n, std::unordered_map<int, DSFrame> in_frames) override
  {
    auto src = in_frames[n];
    if (bypass)
      return src;
    auto dst = src.Create(false);

    for (int p = 0; p < in_vi.Format.Planes; p++)
    {
      bool chroma = in_vi.Format.IsFamilyYUV && p > 0 && p < 3;
      auto height = in_vi.Height;
      auto width = in_vi.Width;
      auto src_stride = src.StrideBytes[p];
      auto src_ptr = src.SrcPointers[p];
      auto dst_stride = dst.StrideBytes[p];
      auto dst_ptr = dst.DstPointers[p];

      if (chroma) {
        height >>= in_vi.Format.SSH;
        width >>= in_vi.Format.SSW;
      }

      if (process[p] == 2) {
        framecpy(dst_ptr, dst_stride, src_ptr, src_stride, width * in_vi.Format.BytesPerSample, height);
        continue;
      }
      if (process[p] != 3)
        continue;

      minideen_core(src_ptr, dst_ptr, width, height, src_stride, dst_stride, threshold[p], radius[p]);
    }

    return dst;
  }